

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::UnitTestImpl::RecordProperty(UnitTestImpl *this,TestProperty *test_property)

{
  TestResult *this_00;
  string xml_element;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  if (this->current_test_info_ == (TestInfo *)0x0) {
    if (this->current_test_suite_ == (TestSuite *)0x0) {
      std::__cxx11::string::assign((char *)&local_30);
      this_00 = &this->ad_hoc_test_result_;
    }
    else {
      std::__cxx11::string::assign((char *)&local_30);
      this_00 = &this->current_test_suite_->ad_hoc_test_result_;
    }
  }
  else {
    std::__cxx11::string::assign((char *)&local_30);
    this_00 = &this->current_test_info_->result_;
  }
  TestResult::RecordProperty(this_00,&local_30,test_property);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void UnitTestImpl::RecordProperty(const TestProperty& test_property) {
  std::string xml_element;
  TestResult* test_result;  // TestResult appropriate for property recording.

  if (current_test_info_ != nullptr) {
    xml_element = "testcase";
    test_result = &(current_test_info_->result_);
  } else if (current_test_suite_ != nullptr) {
    xml_element = "testsuite";
    test_result = &(current_test_suite_->ad_hoc_test_result_);
  } else {
    xml_element = "testsuites";
    test_result = &ad_hoc_test_result_;
  }
  test_result->RecordProperty(xml_element, test_property);
}